

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

string * __thiscall
AixLog::to_string_abi_cxx11_(string *__return_storage_ptr__,AixLog *this,Severity logSeverity)

{
  char *pcVar1;
  char *pcVar2;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Trace";
    pcVar1 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Debug";
    pcVar1 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Info";
    pcVar1 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Notice";
    pcVar1 = "";
    break;
  case 4:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Warn";
    pcVar1 = "";
    break;
  case 5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Error";
    pcVar1 = "";
    break;
  case 6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "Fatal";
    pcVar1 = "";
    break;
  default:
    std::__cxx11::stringstream::stringstream(asStack_198);
    std::ostream::operator<<(local_188,(int)(char)((ulong)this & 0xffffffff));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_198);
    std::ios_base::~ios_base(local_118);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(Severity logSeverity) {
  switch (logSeverity) {
    case Severity::trace:
      return "Trace";
    case Severity::debug:
      return "Debug";
    case Severity::info:
      return "Info";
    case Severity::notice:
      return "Notice";
    case Severity::warning:
      return "Warn";
    case Severity::error:
      return "Error";
    case Severity::fatal:
      return "Fatal";
    default:
      std::stringstream ss;
      ss << static_cast<int>(logSeverity);
      return ss.str();
  }
}